

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestGroupStats::TestGroupStats(TestGroupStats *this,GroupInfo *_groupInfo)

{
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_001fcf50;
  GroupInfo::GroupInfo(&this->groupInfo,_groupInfo);
  (this->totals).error = 0;
  (this->totals).assertions.passed = 0;
  (this->totals).assertions.failed = 0;
  (this->totals).assertions.failedButOk = 0;
  (this->totals).testCases.passed = 0;
  (this->totals).testCases.failed = 0;
  (this->totals).testCases.failedButOk = 0;
  this->aborting = false;
  return;
}

Assistant:

TestGroupStats::TestGroupStats( GroupInfo const& _groupInfo )
    :   groupInfo( _groupInfo ),
        aborting( false )
    {}